

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O3

int get_symbol_value(ListNode *head,char **symbol_names,size_t number_of_symbol_names,void **output)

{
  ListNode *head_00;
  char *value;
  void *pvVar1;
  ListNode *__ptr;
  ListNode *pLVar2;
  ListNode *pLVar3;
  ListNode *node;
  int iVar4;
  long in_FS_OFFSET;
  ListNode *target_node;
  ListNode *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = (ListNode *)0x0;
  if (head == (ListNode *)0x0) {
    cm_print_error("%s\n","head");
    _fail("/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O3/_deps/cmocka-src/src/cmocka.c"
          ,0x314);
  }
  if (symbol_names == (char **)0x0) {
    cm_print_error("%s\n","symbol_names");
    _fail("/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O3/_deps/cmocka-src/src/cmocka.c"
          ,0x315);
  }
  if (number_of_symbol_names == 0) {
    cm_print_error("%s\n","number_of_symbol_names");
    _fail("/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O3/_deps/cmocka-src/src/cmocka.c"
          ,0x316);
  }
  if (output != (void **)0x0) {
    value = *symbol_names;
    iVar4 = list_find(head,value,(EqualityFunction)&local_40,(ListNode **)output);
    node = local_40;
    if (iVar4 == 0) {
      iVar4 = 0;
      cm_print_error("No entries for symbol %s.\n",value);
    }
    else {
      if (local_40 == (ListNode *)0x0) {
        cm_print_error("%s\n","target_node");
        _fail("/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O3/_deps/cmocka-src/src/cmocka.c"
              ,0x31e);
      }
      pvVar1 = local_40->value;
      if (pvVar1 == (void *)0x0) {
        cm_print_error("%s\n","target_node->value");
        _fail("/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O3/_deps/cmocka-src/src/cmocka.c"
              ,799);
      }
      head_00 = (ListNode *)((long)pvVar1 + 8);
      if (number_of_symbol_names == 1) {
        __ptr = *(ListNode **)((long)pvVar1 + 0x18);
        if (__ptr == head_00) {
          cm_print_error("%s\n","return_value");
          _fail("/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O3/_deps/cmocka-src/src/cmocka.c"
                ,0x327);
        }
        *output = __ptr->value;
        iVar4 = __ptr->refcount;
        if (iVar4 == 1) {
          pLVar2 = __ptr->next;
          pLVar3 = __ptr->prev;
          pLVar3->next = pLVar2;
          pLVar2->prev = pLVar3;
          free(__ptr);
          iVar4 = 1;
        }
        else if (-2 < iVar4) {
          __ptr->refcount = iVar4 + -1;
        }
      }
      else {
        iVar4 = get_symbol_value(head_00,symbol_names + 1,1,output);
      }
      if (*(ListNode **)((long)pvVar1 + 0x18) == head_00) {
        list_remove_free(node,free_symbol_map_value,(void *)0x0);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return iVar4;
    }
    __stack_chk_fail();
  }
  cm_print_error("%s\n","output");
  _fail("/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O3/_deps/cmocka-src/src/cmocka.c"
        ,0x317);
}

Assistant:

static int get_symbol_value(
        ListNode * const head, const char * const symbol_names[],
        const size_t number_of_symbol_names, void **output) {
    const char* symbol_name = NULL;
    ListNode *target_node = NULL;
    assert_non_null(head);
    assert_non_null(symbol_names);
    assert_true(number_of_symbol_names);
    assert_non_null(output);
    symbol_name = symbol_names[0];

    if (list_find(head, symbol_name, symbol_names_match, &target_node)) {
        SymbolMapValue *map_value = NULL;
        ListNode *child_list = NULL;
        int return_value = 0;
        assert_non_null(target_node);
        assert_non_null(target_node->value);

        map_value = (SymbolMapValue*)target_node->value;
        child_list = &map_value->symbol_values_list_head;

        if (number_of_symbol_names == 1) {
            ListNode *value_node = NULL;
            return_value = list_first(child_list, &value_node);
            assert_true(return_value);
            /* Add a check to silence clang analyzer */
            if (return_value == 0) {
                goto out;
            }
            *output = (void*) value_node->value;
            return_value = value_node->refcount;
            if (value_node->refcount - 1 == 0) {
                list_remove_free(value_node, NULL, NULL);
            } else if (value_node->refcount > WILL_RETURN_ONCE) {
                --value_node->refcount;
            }
        } else {
            return_value = get_symbol_value(
                child_list, &symbol_names[1], number_of_symbol_names - 1,
                output);
        }
        if (list_empty(child_list)) {
            list_remove_free(target_node, free_symbol_map_value, (void*)0);
        }
        return return_value;
    }
out:
    cm_print_error("No entries for symbol %s.\n", symbol_name);
    return 0;
}